

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

void ui_enter_birthscreen(game_event_type type,game_event_data *data,void *user)

{
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  quickstart_allowed = (_Bool)(data->flag & 1);
  setup_menus();
  return;
}

Assistant:

static void ui_enter_birthscreen(game_event_type type, game_event_data *data,
								 void *user)
{
	/* Set the ugly static global that tells us if quickstart's available. */
	quickstart_allowed = data->flag;

	setup_menus();
}